

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutations.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
wasm::makeIdentity(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                  Index num)

{
  reference pvVar1;
  undefined4 local_28;
  Index i;
  Index num_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ret;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,(ulong)num);
  for (local_28 = 0; local_28 < num; local_28 = local_28 + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)local_28);
    *pvVar1 = local_28;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<Index> makeIdentity(Index num) {
  std::vector<Index> ret;
  ret.resize(num);
  for (Index i = 0; i < num; i++) {
    ret[i] = i;
  }
  return ret;
}